

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall
QIconModeViewBase::dataChanged
          (QIconModeViewBase *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Promoted<long_long,_int> PVar5;
  int iVar6;
  QSize in_RDX;
  QCommonListViewBase *in_RSI;
  QStyleOptionViewItem *in_RDI;
  long in_FS_OFFSET;
  int row;
  bool useItemSize;
  int bottom;
  QSize s;
  QStyleOptionViewItem option;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffec0;
  uint uVar7;
  int local_118;
  int local_114;
  int local_110;
  int local_10c [8];
  QSize local_ec;
  int local_e4;
  qsizetype local_e0;
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QCommonListViewBase::column((QCommonListViewBase *)in_RDI);
  iVar3 = QModelIndex::column((QModelIndex *)in_RSI);
  if (iVar3 <= iVar2) {
    iVar3 = QCommonListViewBase::column((QCommonListViewBase *)in_RDI);
    iVar4 = QModelIndex::column((QModelIndex *)in_RDX);
    if (iVar3 <= iVar4) {
      memset(local_d8,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x886700);
      QCommonListViewBase::initViewItemOption
                ((QCommonListViewBase *)in_RDI,
                 (QStyleOptionViewItem *)CONCAT44(iVar3,in_stack_fffffffffffffea8));
      local_e0 = QList<QListViewItem>::size((QList<QListViewItem> *)&in_RDI->field_0x60);
      local_e4 = QModelIndex::row((QModelIndex *)in_RDX);
      local_e4 = local_e4 + 1;
      PVar5 = qMin<long_long,int>(&local_e0,&local_e4);
      iVar6 = (int)PVar5;
      bVar1 = QSize::isValid((QSize *)CONCAT44(iVar6,in_stack_fffffffffffffec0));
      uVar7 = ((uint)bVar1 << 0x18 ^ 0xff000000) & 0x1ffffff;
      for (iVar4 = QModelIndex::row((QModelIndex *)in_RSI); iVar4 < iVar6; iVar4 = iVar4 + 1) {
        local_ec = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QCommonListViewBase::modelIndex(in_RSI,in_RDX.ht.m_i.m_i);
        local_ec = QCommonListViewBase::itemSize
                             ((QCommonListViewBase *)CONCAT44(iVar4,iVar2),in_RDI,
                              (QModelIndex *)CONCAT44(iVar3,in_stack_fffffffffffffea8));
        if ((uVar7 & 0x1000000) == 0) {
          local_10c[0] = QSize::width((QSize *)0x8867e0);
          local_110 = QSize::width((QSize *)0x8867ee);
          qMin<int>(local_10c,&local_110);
          QSize::setWidth((QSize *)in_RDI,iVar3);
          local_114 = QSize::height((QSize *)0x886822);
          local_118 = QSize::height((QSize *)0x886830);
          qMin<int>(&local_114,&local_118);
          QSize::setHeight((QSize *)in_RDI,iVar3);
        }
        QList<QListViewItem>::operator[]
                  ((QList<QListViewItem> *)in_RDI,CONCAT44(iVar3,in_stack_fffffffffffffea8));
        QListViewItem::resize((QListViewItem *)in_RDI,in_RDX);
      }
      QStyleOptionViewItem::~QStyleOptionViewItem(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    if (column() >= topLeft.column() && column() <= bottomRight.column())  {
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        const int bottom = qMin(items.size(), bottomRight.row() + 1);
        const bool useItemSize = !dd->grid.isValid();
        for (int row = topLeft.row(); row < bottom; ++row)
        {
            QSize s = itemSize(option, modelIndex(row));
            if (!useItemSize)
            {
                s.setWidth(qMin(dd->grid.width(), s.width()));
                s.setHeight(qMin(dd->grid.height(), s.height()));
            }
            items[row].resize(s);
        }
    }
}